

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeList.h
# Opt level: O2

CNodeType * __thiscall
Refal2::CNodeList<Refal2::CHole>::Append(CNodeList<Refal2::CHole> *this,CHole *value)

{
  int iVar1;
  undefined4 extraout_var;
  CNodeType *pCVar2;
  
  if (this->last == (CNodeType *)0x0) {
    iVar1 = (*this->_vptr_CNodeList[3])(this,value);
    pCVar2 = (CNodeType *)CONCAT44(extraout_var,iVar1);
    this->first = pCVar2;
    this->last = pCVar2;
  }
  else {
    InsertAfter(this,this->last,value);
    pCVar2 = this->last;
  }
  return pCVar2;
}

Assistant:

typename CNodeList<T>::CNodeType* CNodeList<T>::Append( const T& value )
{
	if( last != nullptr ) {
		InsertAfter( last, value );
	} else {
		first = Alloc( value );
		last = first;
	}
	return last;
}